

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

int flatcc_json_printer_init(flatcc_json_printer_t *ctx,void *fp)

{
  char *pcVar1;
  void *local_28;
  void *fp_local;
  flatcc_json_printer_t *ctx_local;
  
  memset(ctx,0,0x50);
  local_28 = fp;
  if (fp == (void *)0x0) {
    local_28 = _stdout;
  }
  ctx->fp = local_28;
  ctx->flush = __flatcc_json_printer_flush;
  pcVar1 = (char *)malloc(0x4040);
  ctx->buf = pcVar1;
  if (pcVar1 == (char *)0x0) {
    ctx_local._4_4_ = -1;
  }
  else {
    ctx->own_buffer = '\x01';
    ctx->size = 0x4040;
    ctx->flush_size = 0x4000;
    ctx->p = ctx->buf;
    ctx->pflush = ctx->buf + ctx->flush_size;
    if (ctx->size < ctx->flush_size + 0x40) {
      __assert_fail("ctx->flush_size + FLATCC_JSON_PRINT_RESERVE <= ctx->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                    ,0x565,"int flatcc_json_printer_init(flatcc_json_printer_t *, void *)");
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int flatcc_json_printer_init(flatcc_json_printer_t *ctx, void *fp)
{
    memset(ctx, 0, sizeof(*ctx));
    ctx->fp = fp ? fp : stdout;
    ctx->flush = __flatcc_json_printer_flush;
    if (!(ctx->buf = FLATCC_JSON_PRINTER_ALLOC(FLATCC_JSON_PRINT_BUFFER_SIZE))) {
        return -1;
    }
    ctx->own_buffer = 1;
    ctx->size = FLATCC_JSON_PRINT_BUFFER_SIZE;
    ctx->flush_size = FLATCC_JSON_PRINT_FLUSH_SIZE;
    ctx->p = ctx->buf;
    ctx->pflush = ctx->buf + ctx->flush_size;
    /*
     * Make sure we have space for primitive operations such as printing numbers
     * without having to flush.
     */
    FLATCC_ASSERT(ctx->flush_size + FLATCC_JSON_PRINT_RESERVE <= ctx->size);
    return 0;
}